

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int big2_scanPoundName(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  undefined1 uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  lVar6 = (long)end - (long)ptr;
  if (lVar6 < 2) {
    return -1;
  }
  bVar1 = *ptr;
  if (bVar1 < 0xdc) {
    bVar3 = 7;
    if (bVar1 - 0xd8 < 4) goto LAB_006075fe;
    if (bVar1 == 0) {
      bVar3 = *(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[1]);
      goto LAB_006075fe;
    }
  }
  else {
    if (bVar1 - 0xdc < 4) {
      bVar3 = 8;
      goto LAB_006075fe;
    }
    if ((bVar1 == 0xff) && (0xfd < (byte)ptr[1])) {
      bVar3 = 0;
      goto LAB_006075fe;
    }
  }
  bVar3 = 0x1d;
LAB_006075fe:
  iVar4 = 0;
  iVar5 = iVar4;
  if (bVar3 < 0x16) {
    if (bVar3 == 6) {
      if (lVar6 == 2) {
        return -2;
      }
    }
    else if ((bVar3 == 7) && (lVar6 < 4)) {
      return -2;
    }
  }
  else if (((bVar3 == 0x16) || (bVar3 == 0x18)) ||
          ((iVar5 = 0, bVar3 == 0x1d &&
           (iVar5 = iVar4,
           (*(uint *)((long)namingBitmap +
                     (ulong)((byte)ptr[1] >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5
                            )) >> ((byte)ptr[1] & 0x1f) & 1) != 0)))) {
    ptr = ptr + 2;
    lVar6 = (long)end - (long)ptr;
    if (lVar6 < 2) {
      return -0x14;
    }
    do {
      bVar1 = *ptr;
      if (bVar1 < 0xdc) {
        uVar2 = 7;
        if (3 < bVar1 - 0xd8) {
          if (bVar1 == 0) {
            uVar2 = *(undefined1 *)((long)enc[1].scanners + (ulong)((byte *)ptr)[1]);
          }
          else {
LAB_006076d7:
            uVar2 = 0x1d;
          }
        }
      }
      else if (bVar1 - 0xdc < 4) {
        uVar2 = 8;
      }
      else {
        if ((bVar1 != 0xff) || (((byte *)ptr)[1] < 0xfe)) goto LAB_006076d7;
        uVar2 = 0;
      }
      iVar5 = iVar4;
      switch(uVar2) {
      case 6:
        if (lVar6 == 2) {
          return -2;
        }
        goto switchD_006076ef_caseD_8;
      case 7:
        if (lVar6 < 4) {
          return -2;
        }
      default:
        goto switchD_006076ef_caseD_8;
      case 9:
      case 10:
      case 0xb:
      case 0x15:
      case 0x1e:
      case 0x20:
      case 0x24:
        iVar5 = 0x14;
        goto switchD_006076ef_caseD_8;
      case 0x1d:
        if ((*(uint *)((long)namingBitmap +
                      (ulong)(((byte *)ptr)[1] >> 3 & 0x1c |
                             (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
             (((byte *)ptr)[1] & 0x1f) & 1) == 0) goto switchD_006076ef_caseD_8;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        ptr = (char *)((byte *)ptr + 2);
        lVar6 = lVar6 + -2;
        if (lVar6 < 2) {
          return -0x14;
        }
      }
    } while( true );
  }
switchD_006076ef_caseD_8:
  *nextTokPtr = ptr;
  return iVar5;
}

Assistant:

static int PTRCALL
PREFIX(scanPoundName)(const ENCODING *enc, const char *ptr, const char *end,
                      const char **nextTokPtr) {
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_CR:
    case BT_LF:
    case BT_S:
    case BT_RPAR:
    case BT_GT:
    case BT_PERCNT:
    case BT_VERBAR:
      *nextTokPtr = ptr;
      return XML_TOK_POUND_NAME;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return -XML_TOK_POUND_NAME;
}